

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_horizontal_8_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  __m128i *in_R8;
  uint in_R9D;
  ushort uVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  ushort uVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  ushort uVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  ushort uVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ushort uVar71;
  undefined1 auVar72 [16];
  __m128i p1p0;
  __m128i q1q0;
  __m128i q3;
  __m128i p3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i workp_shft1;
  __m128i workp_shft0;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i one;
  __m128i t80;
  __m128i four;
  __m128i abs_p1p0;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i opq2;
  __m128i work_a;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i q1q0_1;
  __m128i p1p0_1;
  __m128i pq [4];
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i zero;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one_1;
  __m128i zero_1;
  undefined4 in_stack_ffffffffffffebb0;
  undefined2 uVar73;
  undefined2 uVar74;
  __m128i *thr;
  __m128i *blt;
  __m128i *lt;
  undefined1 (*pauVar75) [16];
  __m128i *pq_00;
  ulong local_13e8;
  ulong uStack_13e0;
  ulong local_13d8;
  ulong uStack_13d0;
  ulong local_13a8;
  ulong local_1358;
  longlong local_10f8;
  longlong lStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  longlong local_1068 [2];
  undefined1 local_1058 [16];
  undefined8 local_1048;
  ulong uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  ulong local_ff8;
  undefined8 uStack_ff0;
  uint uStack_fec;
  ulong local_fe8;
  longlong local_fd8 [2];
  longlong local_fc8 [2];
  longlong local_fb8 [2];
  undefined8 local_fa8;
  __m128i *bl;
  undefined4 in_stack_fffffffffffff068;
  undefined8 local_e08;
  undefined1 local_df8 [16];
  undefined8 local_de8;
  uint uStack_ddc;
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [16];
  undefined1 local_db8 [16];
  undefined8 local_d98;
  undefined8 uStack_d90;
  short local_bc8;
  short sStack_bc6;
  short sStack_bc4;
  short sStack_bc2;
  short local_bb8;
  short sStack_bb6;
  short sStack_bb4;
  short sStack_bb2;
  short sStack_bb0;
  short sStack_bae;
  short sStack_bac;
  short sStack_baa;
  short local_ba8;
  short sStack_ba6;
  short sStack_ba4;
  short sStack_ba2;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short local_a28;
  short sStack_a26;
  short sStack_a24;
  short sStack_a22;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short local_958;
  short sStack_956;
  short sStack_954;
  short sStack_952;
  short local_948;
  short sStack_946;
  short sStack_944;
  short sStack_942;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short local_8d8;
  short sStack_8d6;
  short sStack_8d4;
  short sStack_8d2;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  undefined4 uStack_740;
  undefined4 uStack_730;
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  ulong local_5a8;
  ulong uStack_5a0;
  ulong local_598;
  ulong uStack_590;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_4a8;
  short sStack_4a6;
  short sStack_4a4;
  short sStack_4a2;
  short sStack_4a0;
  short sStack_49e;
  short sStack_49c;
  short sStack_49a;
  short local_498;
  short sStack_496;
  short sStack_494;
  short sStack_492;
  short sStack_490;
  short sStack_48e;
  short sStack_48c;
  short sStack_48a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1d8;
  short sStack_1d6;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  sVar31 = local_de8._6_2_;
  sVar30 = local_de8._4_2_;
  uVar1 = *(undefined8 *)((long)in_RDI + (long)(in_ESI << 2) * -2);
  uVar2 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 3) * 2);
  local_1358 = *(ulong *)((long)in_RDI + (long)(in_ESI * 3) * -2);
  local_13a8 = *(ulong *)((long)in_RDI + (long)(in_ESI * 2) * 2);
  uVar3 = *(undefined8 *)((long)in_RDI + (long)(in_ESI * 2) * -2);
  uVar4 = *(undefined8 *)((long)in_RDI + (long)in_ESI * 2);
  uVar5 = *(undefined8 *)((long)in_RDI + (long)in_ESI * -2);
  uVar6 = *in_RDI;
  local_fa8 = 0;
  bl = (__m128i *)0x0;
  uVar73 = 4;
  local_10e8 = 0x4000400040004;
  uStack_10e0 = 0x4000400040004;
  uVar74 = 1;
  thr = &local_fd8;
  blt = &local_fb8;
  lt = &local_fc8;
  local_1048 = uVar5;
  uStack_1040 = uVar6;
  local_1038 = uVar3;
  uStack_1030 = uVar4;
  local_1028 = local_1358;
  uStack_1020 = local_13a8;
  local_1018 = uVar1;
  uStack_1010 = uVar2;
  get_limit(in_RDX,(uint8_t *)in_RCX,(uint8_t *)in_R8,in_R9D,blt,lt,thr,(__m128i *)&local_10f8);
  pauVar75 = &local_1058;
  pq_00 = &local_1068;
  highbd_hev_filter_mask_x_sse2
            (pq_00,(int)((ulong)pauVar75 >> 0x20),lt,blt,thr,
             (__m128i *)CONCAT26(uVar74,CONCAT24(uVar73,in_stack_ffffffffffffebb0)),bl,
             (__m128i *)CONCAT44(in_R9D,in_stack_fffffffffffff068),in_R8,in_RCX);
  auVar38._8_8_ = 0x1000100010001;
  auVar38._0_8_ = 0x1000100010001;
  auVar72 = psllw(auVar38,ZEXT416(in_R9D));
  auVar17._8_8_ = 0x1000100010001;
  auVar17._0_8_ = 0x1000100010001;
  auVar72 = psubsw(auVar72,auVar17);
  auVar23._8_8_ = lStack_10f0;
  auVar23._0_8_ = local_10f8;
  auVar72 = psubsw(auVar72,auVar23);
  auVar24._8_8_ = lStack_10f0;
  auVar24._0_8_ = local_10f8;
  psubsw(ZEXT816(0),auVar24);
  auVar25._8_8_ = lStack_10f0;
  auVar25._0_8_ = local_10f8;
  auVar38 = psubsw(*pauVar75,auVar25);
  auVar26._8_8_ = lStack_10f0;
  auVar26._0_8_ = local_10f8;
  auVar39 = psubsw((undefined1  [16])*pq_00,auVar26);
  local_dd8 = psubsw(auVar38,auVar39);
  local_98 = local_dd8._0_2_;
  sStack_96 = local_dd8._2_2_;
  sStack_94 = local_dd8._4_2_;
  sStack_92 = local_dd8._6_2_;
  sStack_90 = local_dd8._8_2_;
  sStack_8e = local_dd8._10_2_;
  sStack_8c = local_dd8._12_2_;
  sStack_8a = local_dd8._14_2_;
  local_a8 = auVar72._0_2_;
  sStack_a6 = auVar72._2_2_;
  sStack_a4 = auVar72._4_2_;
  sStack_a2 = auVar72._6_2_;
  sStack_a0 = auVar72._8_2_;
  sStack_9e = auVar72._10_2_;
  sStack_9c = auVar72._12_2_;
  sStack_9a = auVar72._14_2_;
  local_dd8._0_2_ =
       (ushort)(local_a8 < local_98) * local_a8 | (ushort)(local_a8 >= local_98) * local_98;
  local_dd8._2_2_ =
       (ushort)(sStack_a6 < sStack_96) * sStack_a6 | (ushort)(sStack_a6 >= sStack_96) * sStack_96;
  local_dd8._4_2_ =
       (ushort)(sStack_a4 < sStack_94) * sStack_a4 | (ushort)(sStack_a4 >= sStack_94) * sStack_94;
  local_dd8._6_2_ =
       (ushort)(sStack_a2 < sStack_92) * sStack_a2 | (ushort)(sStack_a2 >= sStack_92) * sStack_92;
  local_dd8._8_2_ =
       (ushort)(sStack_a0 < sStack_90) * sStack_a0 | (ushort)(sStack_a0 >= sStack_90) * sStack_90;
  local_dd8._10_2_ =
       (ushort)(sStack_9e < sStack_8e) * sStack_9e | (ushort)(sStack_9e >= sStack_8e) * sStack_8e;
  local_dd8._12_2_ =
       (ushort)(sStack_9c < sStack_8c) * sStack_9c | (ushort)(sStack_9c >= sStack_8c) * sStack_8c;
  local_dd8._14_2_ =
       (ushort)(sStack_9a < sStack_8a) * sStack_9a | (ushort)(sStack_9a >= sStack_8a) * sStack_8a;
  local_198 = local_dd8._0_2_;
  sStack_196 = local_dd8._2_2_;
  sStack_194 = local_dd8._4_2_;
  sStack_192 = local_dd8._6_2_;
  sStack_190 = local_dd8._8_2_;
  sStack_18e = local_dd8._10_2_;
  sStack_18c = local_dd8._12_2_;
  sStack_18a = local_dd8._14_2_;
  local_1a8 = (short)local_d98;
  sStack_1a6 = (short)((ulong)local_d98 >> 0x10);
  sStack_1a4 = (short)((ulong)local_d98 >> 0x20);
  sStack_1a2 = (short)((ulong)local_d98 >> 0x30);
  sStack_1a0 = (short)uStack_d90;
  sStack_19e = (short)((ulong)uStack_d90 >> 0x10);
  sStack_19c = (short)((ulong)uStack_d90 >> 0x20);
  sStack_19a = (short)((ulong)uStack_d90 >> 0x30);
  local_dd8._0_2_ =
       (ushort)(local_198 < local_1a8) * local_1a8 | (ushort)(local_198 >= local_1a8) * local_198;
  local_dd8._2_2_ =
       (ushort)(sStack_196 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_196 >= sStack_1a6) * sStack_196;
  local_dd8._4_2_ =
       (ushort)(sStack_194 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_194 >= sStack_1a4) * sStack_194;
  local_dd8._6_2_ =
       (ushort)(sStack_192 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_192 >= sStack_1a2) * sStack_192;
  local_dd8._8_2_ =
       (ushort)(sStack_190 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_190 >= sStack_1a0) * sStack_190;
  local_dd8._10_2_ =
       (ushort)(sStack_18e < sStack_19e) * sStack_19e |
       (ushort)(sStack_18e >= sStack_19e) * sStack_18e;
  local_dd8._12_2_ =
       (ushort)(sStack_18c < sStack_19c) * sStack_19c |
       (ushort)(sStack_18c >= sStack_19c) * sStack_18c;
  local_dd8._14_2_ =
       (ushort)(sStack_18a < sStack_19a) * sStack_19a |
       (ushort)(sStack_18a >= sStack_19a) * sStack_18a;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_dd8._8_8_ & local_ff8;
  auVar72 = psubsw(auVar16,local_dd8);
  auVar72 = psubsw(auVar72,local_dd8);
  auVar72 = psubsw(auVar72,local_dd8);
  local_de8 = auVar72._0_8_;
  local_78 = auVar72._0_2_;
  sStack_76 = auVar72._2_2_;
  sStack_74 = auVar72._4_2_;
  sStack_72 = auVar72._6_2_;
  local_de8._0_2_ =
       (ushort)(local_a8 < local_78) * local_a8 | (ushort)(local_a8 >= local_78) * local_78;
  local_de8._2_2_ =
       (ushort)(sStack_a6 < sStack_76) * sStack_a6 | (ushort)(sStack_a6 >= sStack_76) * sStack_76;
  local_de8._4_2_ =
       (ushort)(sStack_a4 < sStack_74) * sStack_a4 | (ushort)(sStack_a4 >= sStack_74) * sStack_74;
  local_de8._6_2_ =
       (ushort)(sStack_a2 < sStack_72) * sStack_a2 | (ushort)(sStack_a2 >= sStack_72) * sStack_72;
  local_1d8 = (short)local_de8;
  sStack_1d6 = (short)(local_de8 >> 0x10);
  local_de8._0_2_ =
       (ushort)(local_1d8 < local_1a8) * local_1a8 | (ushort)(local_1d8 >= local_1a8) * local_1d8;
  local_de8._2_2_ =
       (ushort)(sStack_1d6 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_1d6 >= sStack_1a6) * sStack_1d6;
  local_de8._4_2_ =
       (ushort)(sVar30 < sStack_1a4) * sStack_1a4 | (ushort)(sVar30 >= sStack_1a4) * sVar30;
  local_de8._6_2_ =
       (ushort)(sVar31 < sStack_1a2) * sStack_1a2 | (ushort)(sVar31 >= sStack_1a2) * sVar31;
  auVar22._8_8_ = local_de8 & local_fe8;
  auVar22._0_8_ = local_de8 & local_fe8;
  auVar21._8_8_ = 0x3000300030003;
  auVar21._0_8_ = 0x4000400040004;
  local_df8 = paddsw(auVar22,auVar21);
  local_58 = local_df8._0_2_;
  sStack_56 = local_df8._2_2_;
  sStack_54 = local_df8._4_2_;
  sStack_52 = local_df8._6_2_;
  sStack_50 = local_df8._8_2_;
  sStack_4e = local_df8._10_2_;
  sStack_4c = local_df8._12_2_;
  sStack_4a = local_df8._14_2_;
  local_df8._0_2_ =
       (ushort)(local_a8 < local_58) * local_a8 | (ushort)(local_a8 >= local_58) * local_58;
  local_df8._2_2_ =
       (ushort)(sStack_a6 < sStack_56) * sStack_a6 | (ushort)(sStack_a6 >= sStack_56) * sStack_56;
  local_df8._4_2_ =
       (ushort)(sStack_a4 < sStack_54) * sStack_a4 | (ushort)(sStack_a4 >= sStack_54) * sStack_54;
  local_df8._6_2_ =
       (ushort)(sStack_a2 < sStack_52) * sStack_a2 | (ushort)(sStack_a2 >= sStack_52) * sStack_52;
  local_df8._8_2_ =
       (ushort)(sStack_a0 < sStack_50) * sStack_a0 | (ushort)(sStack_a0 >= sStack_50) * sStack_50;
  local_df8._10_2_ =
       (ushort)(sStack_9e < sStack_4e) * sStack_9e | (ushort)(sStack_9e >= sStack_4e) * sStack_4e;
  local_df8._12_2_ =
       (ushort)(sStack_9c < sStack_4c) * sStack_9c | (ushort)(sStack_9c >= sStack_4c) * sStack_4c;
  local_df8._14_2_ =
       (ushort)(sStack_9a < sStack_4a) * sStack_9a | (ushort)(sStack_9a >= sStack_4a) * sStack_4a;
  local_218 = local_df8._0_2_;
  sStack_216 = local_df8._2_2_;
  sStack_214 = local_df8._4_2_;
  sStack_212 = local_df8._6_2_;
  sStack_210 = local_df8._8_2_;
  sStack_20e = local_df8._10_2_;
  sStack_20c = local_df8._12_2_;
  sStack_20a = local_df8._14_2_;
  local_df8._0_2_ =
       (ushort)(local_218 < local_1a8) * local_1a8 | (ushort)(local_218 >= local_1a8) * local_218;
  local_df8._2_2_ =
       (ushort)(sStack_216 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_216 >= sStack_1a6) * sStack_216;
  local_df8._4_2_ =
       (ushort)(sStack_214 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_214 >= sStack_1a4) * sStack_214;
  local_df8._6_2_ =
       (ushort)(sStack_212 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_212 >= sStack_1a2) * sStack_212;
  local_df8._8_2_ =
       (ushort)(sStack_210 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_210 >= sStack_1a0) * sStack_210;
  local_df8._10_2_ =
       (ushort)(sStack_20e < sStack_19e) * sStack_19e |
       (ushort)(sStack_20e >= sStack_19e) * sStack_20e;
  local_df8._12_2_ =
       (ushort)(sStack_20c < sStack_19c) * sStack_19c |
       (ushort)(sStack_20c >= sStack_19c) * sStack_20c;
  local_df8._14_2_ =
       (ushort)(sStack_20a < sStack_19a) * sStack_19a |
       (ushort)(sStack_20a >= sStack_19a) * sStack_20a;
  auVar72 = psraw(local_df8,ZEXT416(3));
  local_df8._0_8_ = auVar72._0_8_;
  auVar20._8_8_ = local_df8._0_8_;
  auVar20._0_8_ = local_df8._0_8_;
  auVar19._8_8_ = 0x1000100010001;
  auVar19._0_8_ = 0x1000100010001;
  auVar40 = paddsw(auVar20,auVar19);
  auVar40 = psraw(auVar40,ZEXT416(1));
  local_de8 = auVar40._0_8_;
  uStack_ddc = ~uStack_fec & auVar40._12_4_;
  local_df8._12_4_ = auVar72._12_4_;
  local_df8._4_4_ = uStack_ddc;
  local_df8._0_4_ = uStack_740;
  auVar15._8_8_ = ~local_ff8 & local_de8;
  auVar15._0_8_ = local_df8._0_8_;
  local_dc8 = psubsw(auVar39,auVar15);
  auVar18._12_4_ = local_df8._12_4_;
  auVar18._8_4_ = uStack_730;
  auVar18._0_8_ = local_e08;
  local_db8 = paddsw(auVar38,auVar18);
  local_38 = local_dc8._0_2_;
  sStack_36 = local_dc8._2_2_;
  sStack_34 = local_dc8._4_2_;
  sStack_32 = local_dc8._6_2_;
  sStack_30 = local_dc8._8_2_;
  sStack_2e = local_dc8._10_2_;
  sStack_2c = local_dc8._12_2_;
  sStack_2a = local_dc8._14_2_;
  local_dc8._0_2_ =
       (ushort)(local_a8 < local_38) * local_a8 | (ushort)(local_a8 >= local_38) * local_38;
  local_dc8._2_2_ =
       (ushort)(sStack_a6 < sStack_36) * sStack_a6 | (ushort)(sStack_a6 >= sStack_36) * sStack_36;
  local_dc8._4_2_ =
       (ushort)(sStack_a4 < sStack_34) * sStack_a4 | (ushort)(sStack_a4 >= sStack_34) * sStack_34;
  local_dc8._6_2_ =
       (ushort)(sStack_a2 < sStack_32) * sStack_a2 | (ushort)(sStack_a2 >= sStack_32) * sStack_32;
  local_dc8._8_2_ =
       (ushort)(sStack_a0 < sStack_30) * sStack_a0 | (ushort)(sStack_a0 >= sStack_30) * sStack_30;
  local_dc8._10_2_ =
       (ushort)(sStack_9e < sStack_2e) * sStack_9e | (ushort)(sStack_9e >= sStack_2e) * sStack_2e;
  local_dc8._12_2_ =
       (ushort)(sStack_9c < sStack_2c) * sStack_9c | (ushort)(sStack_9c >= sStack_2c) * sStack_2c;
  local_dc8._14_2_ =
       (ushort)(sStack_9a < sStack_2a) * sStack_9a | (ushort)(sStack_9a >= sStack_2a) * sStack_2a;
  local_258 = local_dc8._0_2_;
  sStack_256 = local_dc8._2_2_;
  sStack_254 = local_dc8._4_2_;
  sStack_252 = local_dc8._6_2_;
  sStack_250 = local_dc8._8_2_;
  sStack_24e = local_dc8._10_2_;
  sStack_24c = local_dc8._12_2_;
  sStack_24a = local_dc8._14_2_;
  local_dc8._0_2_ =
       (ushort)(local_258 < local_1a8) * local_1a8 | (ushort)(local_258 >= local_1a8) * local_258;
  local_dc8._2_2_ =
       (ushort)(sStack_256 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_256 >= sStack_1a6) * sStack_256;
  local_dc8._4_2_ =
       (ushort)(sStack_254 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_254 >= sStack_1a4) * sStack_254;
  local_dc8._6_2_ =
       (ushort)(sStack_252 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_252 >= sStack_1a2) * sStack_252;
  local_dc8._8_2_ =
       (ushort)(sStack_250 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_250 >= sStack_1a0) * sStack_250;
  local_dc8._10_2_ =
       (ushort)(sStack_24e < sStack_19e) * sStack_19e |
       (ushort)(sStack_24e >= sStack_19e) * sStack_24e;
  local_dc8._12_2_ =
       (ushort)(sStack_24c < sStack_19c) * sStack_19c |
       (ushort)(sStack_24c >= sStack_19c) * sStack_24c;
  local_dc8._14_2_ =
       (ushort)(sStack_24a < sStack_19a) * sStack_19a |
       (ushort)(sStack_24a >= sStack_19a) * sStack_24a;
  local_18 = local_db8._0_2_;
  sStack_16 = local_db8._2_2_;
  sStack_14 = local_db8._4_2_;
  sStack_12 = local_db8._6_2_;
  sStack_10 = local_db8._8_2_;
  sStack_e = local_db8._10_2_;
  sStack_c = local_db8._12_2_;
  sStack_a = local_db8._14_2_;
  local_db8._0_2_ =
       (ushort)(local_a8 < local_18) * local_a8 | (ushort)(local_a8 >= local_18) * local_18;
  local_db8._2_2_ =
       (ushort)(sStack_a6 < sStack_16) * sStack_a6 | (ushort)(sStack_a6 >= sStack_16) * sStack_16;
  local_db8._4_2_ =
       (ushort)(sStack_a4 < sStack_14) * sStack_a4 | (ushort)(sStack_a4 >= sStack_14) * sStack_14;
  local_db8._6_2_ =
       (ushort)(sStack_a2 < sStack_12) * sStack_a2 | (ushort)(sStack_a2 >= sStack_12) * sStack_12;
  local_db8._8_2_ =
       (ushort)(sStack_a0 < sStack_10) * sStack_a0 | (ushort)(sStack_a0 >= sStack_10) * sStack_10;
  local_db8._10_2_ =
       (ushort)(sStack_9e < sStack_e) * sStack_9e | (ushort)(sStack_9e >= sStack_e) * sStack_e;
  local_db8._12_2_ =
       (ushort)(sStack_9c < sStack_c) * sStack_9c | (ushort)(sStack_9c >= sStack_c) * sStack_c;
  local_db8._14_2_ =
       (ushort)(sStack_9a < sStack_a) * sStack_9a | (ushort)(sStack_9a >= sStack_a) * sStack_a;
  local_298 = local_db8._0_2_;
  sStack_296 = local_db8._2_2_;
  sStack_294 = local_db8._4_2_;
  sStack_292 = local_db8._6_2_;
  sStack_290 = local_db8._8_2_;
  sStack_28e = local_db8._10_2_;
  sStack_28c = local_db8._12_2_;
  sStack_28a = local_db8._14_2_;
  local_db8._0_2_ =
       (ushort)(local_298 < local_1a8) * local_1a8 | (ushort)(local_298 >= local_1a8) * local_298;
  local_db8._2_2_ =
       (ushort)(sStack_296 < sStack_1a6) * sStack_1a6 |
       (ushort)(sStack_296 >= sStack_1a6) * sStack_296;
  local_db8._4_2_ =
       (ushort)(sStack_294 < sStack_1a4) * sStack_1a4 |
       (ushort)(sStack_294 >= sStack_1a4) * sStack_294;
  local_db8._6_2_ =
       (ushort)(sStack_292 < sStack_1a2) * sStack_1a2 |
       (ushort)(sStack_292 >= sStack_1a2) * sStack_292;
  local_db8._8_2_ =
       (ushort)(sStack_290 < sStack_1a0) * sStack_1a0 |
       (ushort)(sStack_290 >= sStack_1a0) * sStack_290;
  local_db8._10_2_ =
       (ushort)(sStack_28e < sStack_19e) * sStack_19e |
       (ushort)(sStack_28e >= sStack_19e) * sStack_28e;
  local_db8._12_2_ =
       (ushort)(sStack_28c < sStack_19c) * sStack_19c |
       (ushort)(sStack_28c >= sStack_19c) * sStack_28c;
  local_db8._14_2_ =
       (ushort)(sStack_28a < sStack_19a) * sStack_19a |
       (ushort)(sStack_28a >= sStack_19a) * sStack_28a;
  auVar27._8_8_ = lStack_10f0;
  auVar27._0_8_ = local_10f8;
  auVar72 = paddsw(local_dc8,auVar27);
  uStack_13d0 = auVar72._8_8_;
  local_13d8 = auVar72._0_8_;
  auVar28._8_8_ = lStack_10f0;
  auVar28._0_8_ = local_10f8;
  auVar72 = paddsw(local_db8,auVar28);
  uStack_13e0 = auVar72._8_8_;
  local_13e8 = auVar72._0_8_;
  auVar9._8_8_ = uStack_1020;
  auVar9._0_8_ = local_1028;
  auVar8._8_8_ = uStack_1040;
  auVar8._0_8_ = local_1048;
  auVar38 = psubusw(auVar9,auVar8);
  auVar7._8_8_ = uStack_1040;
  auVar7._0_8_ = local_1048;
  auVar40._8_8_ = uStack_1020;
  auVar40._0_8_ = local_1028;
  auVar72 = psubusw(auVar7,auVar40);
  local_598 = auVar38._0_8_;
  uStack_590 = auVar38._8_8_;
  local_5a8 = auVar72._0_8_;
  uStack_5a0 = auVar72._8_8_;
  local_598 = local_598 | local_5a8;
  uStack_590 = uStack_590 | uStack_5a0;
  auVar13._8_8_ = uStack_1010;
  auVar13._0_8_ = local_1018;
  auVar12._8_8_ = uStack_1040;
  auVar12._0_8_ = local_1048;
  auVar38 = psubusw(auVar13,auVar12);
  auVar11._8_8_ = uStack_1040;
  auVar11._0_8_ = local_1048;
  auVar10._8_8_ = uStack_1010;
  auVar10._0_8_ = local_1018;
  auVar72 = psubusw(auVar11,auVar10);
  local_5d8 = auVar38._0_8_;
  uStack_5d0 = auVar38._8_8_;
  local_5e8 = auVar72._0_8_;
  uStack_5e0 = auVar72._8_8_;
  local_5d8 = local_5d8 | local_5e8;
  uStack_5d0 = uStack_5d0 | uStack_5e0;
  local_498 = (short)local_598;
  sStack_496 = (short)(local_598 >> 0x10);
  sStack_494 = (short)(local_598 >> 0x20);
  sStack_492 = (short)(local_598 >> 0x30);
  sStack_490 = (short)uStack_590;
  sStack_48e = (short)(uStack_590 >> 0x10);
  sStack_48c = (short)(uStack_590 >> 0x20);
  sStack_48a = (short)(uStack_590 >> 0x30);
  local_4a8 = (short)local_5d8;
  sStack_4a6 = (short)(local_5d8 >> 0x10);
  sStack_4a4 = (short)(local_5d8 >> 0x20);
  sStack_4a2 = (short)(local_5d8 >> 0x30);
  sStack_4a0 = (short)uStack_5d0;
  sStack_49e = (short)(uStack_5d0 >> 0x10);
  sStack_49c = (short)(uStack_5d0 >> 0x20);
  sStack_49a = (short)(uStack_5d0 >> 0x30);
  uVar29 = (ushort)(local_498 < local_4a8) * local_4a8 |
           (ushort)(local_498 >= local_4a8) * local_498;
  uVar41 = (ushort)(sStack_496 < sStack_4a6) * sStack_4a6 |
           (ushort)(sStack_496 >= sStack_4a6) * sStack_496;
  uVar50 = (ushort)(sStack_494 < sStack_4a4) * sStack_4a4 |
           (ushort)(sStack_494 >= sStack_4a4) * sStack_494;
  uVar59 = (ushort)(sStack_492 < sStack_4a2) * sStack_4a2 |
           (ushort)(sStack_492 >= sStack_4a2) * sStack_492;
  uVar68 = (ushort)(sStack_490 < sStack_4a0) * sStack_4a0 |
           (ushort)(sStack_490 >= sStack_4a0) * sStack_490;
  uVar69 = (ushort)(sStack_48e < sStack_49e) * sStack_49e |
           (ushort)(sStack_48e >= sStack_49e) * sStack_48e;
  uVar70 = (ushort)(sStack_48c < sStack_49c) * sStack_49c |
           (ushort)(sStack_48c >= sStack_49c) * sStack_48c;
  uVar71 = (ushort)(sStack_48a < sStack_49a) * sStack_49a |
           (ushort)(sStack_48a >= sStack_49a) * sStack_48a;
  local_4b8 = (short)local_10d8;
  sStack_4b6 = (short)((ulong)local_10d8 >> 0x10);
  sStack_4b4 = (short)((ulong)local_10d8 >> 0x20);
  sStack_4b2 = (short)((ulong)local_10d8 >> 0x30);
  sStack_4b0 = (short)uStack_10d0;
  sStack_4ae = (short)((ulong)uStack_10d0 >> 0x10);
  sStack_4ac = (short)((ulong)uStack_10d0 >> 0x20);
  sStack_4aa = (short)((ulong)uStack_10d0 >> 0x30);
  uVar29 = (local_4b8 < (short)uVar29) * uVar29 | (ushort)(local_4b8 >= (short)uVar29) * local_4b8;
  uVar41 = (sStack_4b6 < (short)uVar41) * uVar41 |
           (ushort)(sStack_4b6 >= (short)uVar41) * sStack_4b6;
  uVar50 = (sStack_4b4 < (short)uVar50) * uVar50 |
           (ushort)(sStack_4b4 >= (short)uVar50) * sStack_4b4;
  uVar59 = (sStack_4b2 < (short)uVar59) * uVar59 |
           (ushort)(sStack_4b2 >= (short)uVar59) * sStack_4b2;
  uVar68 = (sStack_4b0 < (short)uVar68) * uVar68 |
           (ushort)(sStack_4b0 >= (short)uVar68) * sStack_4b0;
  uVar69 = (sStack_4ae < (short)uVar69) * uVar69 |
           (ushort)(sStack_4ae >= (short)uVar69) * sStack_4ae;
  uVar70 = (sStack_4ac < (short)uVar70) * uVar70 |
           (ushort)(sStack_4ac >= (short)uVar70) * sStack_4ac;
  uVar71 = (sStack_4aa < (short)uVar71) * uVar71 |
           (ushort)(sStack_4aa >= (short)uVar71) * sStack_4aa;
  local_1008._0_4_ =
       CONCAT22(((short)uVar41 < (short)uVar69) * uVar69 | ((short)uVar41 >= (short)uVar69) * uVar41
                ,((short)uVar29 < (short)uVar68) * uVar68 |
                 ((short)uVar29 >= (short)uVar68) * uVar29);
  local_1008._0_6_ =
       CONCAT24(((short)uVar50 < (short)uVar70) * uVar70 | ((short)uVar50 >= (short)uVar70) * uVar50
                ,(undefined4)local_1008);
  local_1008 = CONCAT26(((short)uVar59 < (short)uVar71) * uVar71 |
                        ((short)uVar59 >= (short)uVar71) * uVar59,(undefined6)local_1008);
  uStack_1000._0_2_ = (-1 < (short)uVar68) * uVar68;
  uStack_1000._2_2_ = (-1 < (short)uVar69) * uVar69;
  uStack_1000._4_2_ = (-1 < (short)uVar70) * uVar70;
  uStack_1000._6_2_ = (-1 < (short)uVar71) * uVar71;
  auVar39._8_8_ = 0x1000100010001;
  auVar39._0_8_ = 0x1000100010001;
  auVar72 = psllw(auVar39,ZEXT416(in_R9D - 8));
  auVar14._8_8_ = uStack_1000;
  auVar14._0_8_ = local_1008;
  auVar72 = psubusw(auVar14,auVar72);
  local_ba8 = auVar72._0_2_;
  sStack_ba6 = auVar72._2_2_;
  sStack_ba4 = auVar72._4_2_;
  sStack_ba2 = auVar72._6_2_;
  local_bb8 = (short)local_fa8;
  sStack_bb6 = (short)((ulong)local_fa8 >> 0x10);
  sStack_bb4 = (short)((ulong)local_fa8 >> 0x20);
  sStack_bb2 = (short)((ulong)local_fa8 >> 0x30);
  sStack_bb0 = (short)bl;
  sStack_bae = (short)((ulong)bl >> 0x10);
  sStack_bac = (short)((ulong)bl >> 0x20);
  sStack_baa = (short)((ulong)bl >> 0x30);
  local_1008._0_4_ = CONCAT22(-(ushort)(sStack_ba6 == sStack_bb6),-(ushort)(local_ba8 == local_bb8))
  ;
  local_1008._0_6_ = CONCAT24(-(ushort)(sStack_ba4 == sStack_bb4),(undefined4)local_1008);
  local_1008 = CONCAT26(-(ushort)(sStack_ba2 == sStack_bb2),(undefined6)local_1008);
  local_1008 = local_1008 & local_fe8;
  local_bc8 = (short)local_1008;
  sStack_bc6 = (short)(local_1008 >> 0x10);
  sStack_bc4 = (short)(local_1008 >> 0x20);
  sStack_bc2 = (short)(local_1008 >> 0x30);
  uVar29 = -(ushort)(sStack_bc2 == sStack_baa);
  auVar72._2_2_ = -(ushort)(sStack_bc6 == sStack_bb6);
  auVar72._0_2_ = -(ushort)(local_bc8 == local_bb8);
  auVar72._4_2_ = -(ushort)(sStack_bc4 == sStack_bb4);
  auVar72._6_2_ = -(ushort)(sStack_bc2 == sStack_bb2);
  auVar72._8_2_ = -(ushort)(local_bc8 == sStack_bb0);
  auVar72._10_2_ = -(ushort)(sStack_bc6 == sStack_bae);
  auVar72._12_2_ = -(ushort)(sStack_bc4 == sStack_bac);
  auVar72._14_2_ = uVar29;
  if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) | (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(uVar29 >> 7) & 1) << 0xe | uVar29 & 0x8000) != 0xffff) {
    local_8b8 = (short)uVar1;
    sStack_8b6 = (short)((ulong)uVar1 >> 0x10);
    sStack_8b4 = (short)((ulong)uVar1 >> 0x20);
    sStack_8b2 = (short)((ulong)uVar1 >> 0x30);
    local_8d8 = (short)local_1358;
    sStack_8d6 = (short)(local_1358 >> 0x10);
    sStack_8d4 = (short)(local_1358 >> 0x20);
    sStack_8d2 = (short)(local_1358 >> 0x30);
    local_8e8 = (short)uVar3;
    sStack_8e6 = (short)((ulong)uVar3 >> 0x10);
    sStack_8e4 = (short)((ulong)uVar3 >> 0x20);
    sStack_8e2 = (short)((ulong)uVar3 >> 0x30);
    local_928 = (short)local_10e8;
    sStack_926 = (short)((ulong)local_10e8 >> 0x10);
    sStack_924 = (short)((ulong)local_10e8 >> 0x20);
    sStack_922 = (short)((ulong)local_10e8 >> 0x30);
    local_948 = (short)uVar5;
    sStack_946 = (short)((ulong)uVar5 >> 0x10);
    sStack_944 = (short)((ulong)uVar5 >> 0x20);
    sStack_942 = (short)((ulong)uVar5 >> 0x30);
    sVar30 = local_8b8 * 2 + local_8d8 + local_8e8 + local_928 + local_948;
    sVar42 = sStack_8b6 * 2 + sStack_8d6 + sStack_8e6 + sStack_926 + sStack_946;
    sVar51 = sStack_8b4 * 2 + sStack_8d4 + sStack_8e4 + sStack_924 + sStack_944;
    sVar60 = sStack_8b2 * 2 + sStack_8d2 + sStack_8e2 + sStack_922 + sStack_942;
    local_958 = (short)uVar6;
    sStack_956 = (short)(uVar6 >> 0x10);
    sStack_954 = (short)(uVar6 >> 0x20);
    sStack_952 = (short)(uVar6 >> 0x30);
    local_9c8 = (short)uVar4;
    sStack_9c6 = (short)((ulong)uVar4 >> 0x10);
    sStack_9c4 = (short)((ulong)uVar4 >> 0x20);
    sStack_9c2 = (short)((ulong)uVar4 >> 0x30);
    sVar31 = local_958 + local_9c8 + local_8e8;
    sVar43 = sStack_956 + sStack_9c6 + sStack_8e6;
    sVar52 = sStack_954 + sStack_9c4 + sStack_8e4;
    sVar61 = sStack_952 + sStack_9c2 + sStack_8e2;
    local_a28 = (short)local_13a8;
    sStack_a26 = (short)(local_13a8 >> 0x10);
    sStack_a24 = (short)(local_13a8 >> 0x20);
    sStack_a22 = (short)(local_13a8 >> 0x30);
    sVar32 = (sVar30 - local_8b8) + local_a28;
    sVar44 = (sVar42 - sStack_8b6) + sStack_a26;
    sVar53 = (sVar51 - sStack_8b4) + sStack_a24;
    sVar62 = (sVar60 - sStack_8b2) + sStack_a22;
    sVar33 = (sVar31 - local_8e8) + local_948;
    sVar45 = (sVar43 - sStack_8e6) + sStack_946;
    sVar54 = (sVar52 - sStack_8e4) + sStack_944;
    sVar63 = (sVar61 - sStack_8e2) + sStack_942;
    local_a88 = (short)uVar2;
    sStack_a86 = (short)((ulong)uVar2 >> 0x10);
    sStack_a84 = (short)((ulong)uVar2 >> 0x20);
    sStack_a82 = (short)((ulong)uVar2 >> 0x30);
    sVar34 = (sVar32 - local_8b8) + local_a88;
    sVar46 = (sVar44 - sStack_8b6) + sStack_a86;
    sVar55 = (sVar53 - sStack_8b4) + sStack_a84;
    sVar64 = (sVar62 - sStack_8b2) + sStack_a82;
    sVar35 = (sVar33 - local_948) + local_958;
    sVar47 = (sVar45 - sStack_946) + sStack_956;
    sVar56 = (sVar54 - sStack_944) + sStack_954;
    sVar65 = (sVar63 - sStack_942) + sStack_952;
    sVar36 = (sVar34 - local_8d8) + local_a88;
    sVar48 = (sVar46 - sStack_8d6) + sStack_a86;
    sVar57 = (sVar55 - sStack_8d4) + sStack_a84;
    sVar66 = (sVar64 - sStack_8d2) + sStack_a82;
    sVar37 = (sVar35 - local_958) + local_9c8;
    sVar49 = (sVar47 - sStack_956) + sStack_9c6;
    sVar58 = (sVar56 - sStack_954) + sStack_9c4;
    sVar67 = (sVar65 - sStack_952) + sStack_9c2;
    local_13d8 = ~local_1008 & local_13d8 |
                 local_1008 &
                 CONCAT26((ushort)(sVar64 + sVar65) >> 3,
                          CONCAT24((ushort)(sVar55 + sVar56) >> 3,
                                   CONCAT22((ushort)(sVar46 + sVar47) >> 3,
                                            (ushort)(sVar34 + sVar35) >> 3)));
    uStack_13d0 = ~local_1008 & uStack_13d0 |
                  local_1008 &
                  CONCAT26((ushort)(sVar66 + sVar67) >> 3,
                           CONCAT24((ushort)(sVar57 + sVar58) >> 3,
                                    CONCAT22((ushort)(sVar48 + sVar49) >> 3,
                                             (ushort)(sVar36 + sVar37) >> 3)));
    local_13e8 = ~local_1008 & local_13e8 |
                 local_1008 &
                 CONCAT26((ushort)(sVar62 + sVar63) >> 3,
                          CONCAT24((ushort)(sVar53 + sVar54) >> 3,
                                   CONCAT22((ushort)(sVar44 + sVar45) >> 3,
                                            (ushort)(sVar32 + sVar33) >> 3)));
    uStack_13e0 = ~local_1008 & uStack_13e0 |
                  local_1008 &
                  CONCAT26((ushort)(sVar60 + sVar61) >> 3,
                           CONCAT24((ushort)(sVar51 + sVar52) >> 3,
                                    CONCAT22((ushort)(sVar42 + sVar43) >> 3,
                                             (ushort)(sVar30 + sVar31) >> 3)));
    local_1358 = ~local_1008 & local_1028 |
                 local_1008 &
                 CONCAT26((ushort)(sVar60 + sStack_952 + sStack_8d2 + sStack_8b2) >> 3,
                          CONCAT24((ushort)(sVar51 + sStack_954 + sStack_8d4 + sStack_8b4) >> 3,
                                   CONCAT22((ushort)(sVar42 + sStack_956 + sStack_8d6 + sStack_8b6)
                                            >> 3,(ushort)(sVar30 + local_958 + local_8d8 + local_8b8
                                                         ) >> 3)));
    local_13a8 = ~local_1008 & uStack_1020 |
                 local_1008 &
                 CONCAT26((ushort)((sVar66 - sStack_8e2) + sStack_a82 +
                                  (sVar67 - sStack_9c2) + sStack_a22) >> 3,
                          CONCAT24((ushort)((sVar57 - sStack_8e4) + sStack_a84 +
                                           (sVar58 - sStack_9c4) + sStack_a24) >> 3,
                                   CONCAT22((ushort)((sVar48 - sStack_8e6) + sStack_a86 +
                                                    (sVar49 - sStack_9c6) + sStack_a26) >> 3,
                                            (ushort)((sVar36 - local_8e8) + local_a88 +
                                                    (sVar37 - local_9c8) + local_a28) >> 3)));
  }
  *(ulong *)((long)in_RDI + (long)(in_ESI * 3) * -2) = local_1358;
  *(ulong *)((long)in_RDI + (long)(in_ESI * 2) * -2) = uStack_13e0;
  *(ulong *)((long)in_RDI + (long)in_ESI * -2) = local_13e8;
  *in_RDI = local_13d8;
  *(ulong *)((long)in_RDI + (long)in_ESI * 2) = uStack_13d0;
  *(ulong *)((long)in_RDI + (long)(in_ESI * 2) * 2) = local_13a8;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_8_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p3, q3;
  __m128i q1q0, p1p0;

  p3 = _mm_loadl_epi64((__m128i *)(s - 4 * p));
  q3 = _mm_loadl_epi64((__m128i *)(s + 3 * p));
  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));

  highbd_lpf_internal_8_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0,
                             &p1p0, _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 3 * p), p2);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
  _mm_storel_epi64((__m128i *)(s + 2 * p), q2);
}